

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.cpp
# Opt level: O0

bool __thiscall LOTKeyPath::matches(LOTKeyPath *this,string *key,uint32_t depth)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffffc8;
  LOTKeyPath *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  bool local_1;
  
  __lhs_00 = in_RDI;
  bVar1 = skip(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_1 = true;
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_EDX;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             size((LOTKeyPath *)0x1ac899);
    if (pbVar3 < __lhs) {
      local_1 = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI,(ulong)in_EDX);
      _Var2 = std::operator==(__lhs_00,in_RSI);
      if (!_Var2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDI,(ulong)in_EDX);
        bVar1 = std::operator==(__lhs,(char *)in_stack_ffffffffffffffc8);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_RDI,(ulong)in_EDX);
          bVar1 = std::operator==(__lhs,(char *)in_stack_ffffffffffffffc8);
          if (!bVar1) {
            return false;
          }
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool LOTKeyPath::matches(const std::string &key, uint32_t depth)
{
    if (skip(key)) {
        // This is an object we programatically create.
        return true;
    }
    if (depth > size()) {
        return false;
    }
    if ((mKeys[depth] == key) || (mKeys[depth] == "*") ||
        (mKeys[depth] == "**")) {
        return true;
    }
    return false;
}